

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

void __thiscall
HighsLpRelaxation::HighsLpRelaxation(HighsLpRelaxation *this,HighsMipSolver *mipsolver)

{
  Highs *this_00;
  allocator local_81 [9];
  string local_78 [2];
  
  this->mipsolver = mipsolver;
  this_00 = &this->lpsolver;
  Highs::Highs(this_00);
  (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->row_ep).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ep).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ep).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ep).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->row_ep).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->row_ep).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->basischeckpoint).super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->basischeckpoint).super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  memset(&this->lprows,0,0xa8);
  (this->row_ep).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ep).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ep).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ep).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ep).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ep).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ap).values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ap).values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ap).values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ap).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ap).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ap).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_78,"output_flag",local_81);
  Highs::setOptionValue(this_00,local_78,false);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::string((string *)local_78,"random_seed",local_81);
  Highs::setOptionValue
            (this_00,local_78,(mipsolver->options_mip_->super_HighsOptionsStruct).random_seed);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::string((string *)local_78,"primal_feasibility_tolerance",local_81);
  Highs::setOptionValue
            (this_00,local_78,
             (mipsolver->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::string((string *)local_78,"dual_feasibility_tolerance",local_81);
  Highs::setOptionValue
            (this_00,local_78,
             (mipsolver->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance * 0.1);
  std::__cxx11::string::~string((string *)local_78);
  this->epochs = 0;
  this->maxNumFractional = 0;
  this->status = kNotSet;
  this->avgSolveIters = 0.0;
  this->numSolved = 0;
  this->numlpiters = 0;
  this->lastAgeCall = 0;
  this->objective = -INFINITY;
  this->currentbasisstored = false;
  this->adjustSymBranchingCol = true;
  (this->row_ep).size = 0;
  return;
}

Assistant:

HighsLpRelaxation::HighsLpRelaxation(const HighsMipSolver& mipsolver)
    : mipsolver(mipsolver) {
  lpsolver.setOptionValue("output_flag", false);
  lpsolver.setOptionValue("random_seed", mipsolver.options_mip_->random_seed);
  lpsolver.setOptionValue("primal_feasibility_tolerance",
                          mipsolver.options_mip_->mip_feasibility_tolerance);
  lpsolver.setOptionValue(
      "dual_feasibility_tolerance",
      mipsolver.options_mip_->mip_feasibility_tolerance * 0.1);
  status = Status::kNotSet;
  numlpiters = 0;
  avgSolveIters = 0;
  numSolved = 0;
  epochs = 0;
  maxNumFractional = 0;
  lastAgeCall = 0;
  objective = -kHighsInf;
  currentbasisstored = false;
  adjustSymBranchingCol = true;
  row_ep.size = 0;
}